

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  long lVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  ushort *puVar10;
  uint in_R9D;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  
  uVar7 = CONCAT71(in_register_00000009,typecode);
  if ((int)uVar7 == 4) {
    uVar7 = CONCAT71(in_register_00000009,*(undefined1 *)((long)c + 8));
    c = *c;
  }
  uVar8 = (ushort)range_start;
  if ((char)uVar7 == '\x03') {
    lVar3 = *(long *)((long)c + 8);
    iVar6 = *c;
    iVar11 = iVar6 + -1;
    uVar13 = 0;
    do {
      if (iVar11 < (int)uVar13) {
        uVar12 = ~uVar13;
        break;
      }
      uVar12 = uVar13 + iVar11 >> 1;
      uVar2 = *(ushort *)(lVar3 + (ulong)uVar12 * 4);
      if (uVar2 < uVar8) {
        uVar13 = uVar12 + 1;
        bVar16 = true;
      }
      else if (uVar8 < uVar2) {
        iVar11 = uVar12 - 1;
        bVar16 = true;
      }
      else {
        bVar16 = false;
        uVar7 = (ulong)uVar12;
      }
      uVar12 = (uint)uVar7;
    } while (bVar16);
    if ((-1 < (int)uVar12) ||
       ((uVar12 != 0xffffffff &&
        (uVar12 = -uVar12 - 2,
        range_start - *(ushort *)(lVar3 + (ulong)uVar12 * 4) <=
        (uint)*(ushort *)(lVar3 + 2 + (ulong)uVar12 * 4))))) {
      uVar13 = 0;
      if ((int)uVar12 < iVar6) {
        puVar10 = (ushort *)(lVar3 + (ulong)uVar12 * 4 + 2);
        uVar13 = 0;
        do {
          uVar12 = uVar12 + 1;
          uVar8 = puVar10[-1];
          if (uVar8 < range_end) {
            uVar2 = *puVar10;
            if (range_end <= (uint)uVar2 + (uint)uVar8) {
              uVar13 = (uVar13 + range_end) - (uint)uVar8;
              goto LAB_0012ca8e;
            }
            uVar15 = ((uint)uVar2 + (uint)uVar8) - range_start;
            if (uVar2 <= uVar15) {
              uVar15 = (uint)uVar2;
            }
            uVar13 = uVar13 + uVar15;
            bVar16 = true;
          }
          else {
LAB_0012ca8e:
            bVar16 = false;
          }
        } while ((bVar16) && (puVar10 = puVar10 + 2, (int)uVar12 < iVar6));
      }
      uVar13 = (uint)(~range_start + range_end <= uVar13);
      goto LAB_0012cb3c;
    }
  }
  else if (((uint)uVar7 & 0xff) == 2) {
    iVar6 = range_end - range_start;
    if (iVar6 == 0 || (int)range_end < (int)range_start) {
      uVar13 = 1;
      goto LAB_0012cb3c;
    }
    iVar11 = *c;
    uVar13 = 0;
    if (iVar11 < iVar6) goto LAB_0012cb3c;
    iVar14 = iVar11 + -1;
    do {
      if (iVar14 < (int)uVar13) {
        uVar12 = ~uVar13;
        break;
      }
      uVar12 = uVar13 + iVar14 >> 1;
      uVar2 = *(ushort *)(*(long *)((long)c + 8) + (ulong)(uVar13 + iVar14 & 0xfffffffe));
      if (uVar2 < uVar8) {
        uVar13 = uVar12 + 1;
        bVar16 = true;
        uVar12 = in_R9D;
      }
      else if (uVar8 < uVar2) {
        iVar14 = uVar12 - 1;
        bVar16 = true;
        uVar12 = in_R9D;
      }
      else {
        bVar16 = false;
      }
      in_R9D = uVar12;
    } while (bVar16);
    if ((-1 < (int)uVar12) && ((int)(uVar12 + iVar6) <= iVar11)) {
      bVar16 = *(short *)(*(long *)((long)c + 8) + -2 + (ulong)(uVar12 + iVar6) * 2) ==
               (short)((short)range_end + -1);
      goto LAB_0012ca38;
    }
  }
  else {
    uVar7 = (ulong)(range_start >> 6);
    uVar9 = -1L << ((byte)range_start & 0x3f);
    uVar5 = -1L << ((byte)range_end & 0x3f);
    uVar4 = (ulong)(range_end >> 6);
    lVar3 = *(long *)((long)c + 8);
    if (range_start >> 6 == range_end >> 6) {
      bVar16 = (uVar9 & ~(uVar5 | *(ulong *)(lVar3 + uVar4 * 8))) == 0;
LAB_0012ca38:
      uVar13 = (uint)bVar16;
      goto LAB_0012cb3c;
    }
    if ((uVar9 <= *(ulong *)(lVar3 + uVar7 * 8)) &&
       ((0xffff < range_end || ((uVar5 | *(ulong *)(lVar3 + uVar4 * 8)) == 0xffffffffffffffff)))) {
      do {
        bVar16 = uVar4 <= uVar7 + 1 || 0x3fe < uVar7;
        uVar13 = (uint)bVar16;
        if (bVar16) break;
        uVar13 = 0;
        lVar1 = uVar7 * 8;
        uVar7 = uVar7 + 1;
      } while (*(long *)(lVar3 + 8 + lVar1) == -1);
      goto LAB_0012cb3c;
    }
  }
  uVar13 = 0;
LAB_0012cb3c:
  return SUB41(uVar13,0);
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}